

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O1

endpoint_type * __thiscall
asio::detail::reactive_socket_service<asio::ip::tcp>::remote_endpoint
          (endpoint_type *__return_storage_ptr__,reactive_socket_service<asio::ip::tcp> *this,
          implementation_type *impl,error_code *ec)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  error_category *peVar5;
  socklen_t sVar6;
  uint tmp_addrlen;
  endpoint_type endpoint;
  socklen_t local_4c;
  data_union local_48;
  
  local_48._8_4_ = 0;
  local_48._12_4_ = 0;
  local_48._16_4_ = 0;
  local_48._20_8_ = 0;
  local_48._0_8_ = 2;
  iVar1 = (impl->super_base_implementation_type).socket_;
  if (iVar1 == -1) {
    std::error_code::operator=(ec,bad_descriptor);
    sVar6 = 0x1c;
  }
  else {
    piVar4 = __errno_location();
    *piVar4 = 0;
    local_4c = 0x1c;
    iVar3 = getpeername(iVar1,(sockaddr *)&local_48.base,&local_4c);
    sVar6 = local_4c;
    iVar1 = *piVar4;
    if (system_category()::instance == '\0') {
      remote_endpoint();
    }
    ec->_M_value = iVar1;
    ec->_M_cat = (error_category *)&system_category()::instance;
    if (iVar3 == 0) {
      peVar5 = (error_category *)std::_V2::system_category();
      ec->_M_value = 0;
      ec->_M_cat = peVar5;
      bVar2 = true;
      goto LAB_001a818a;
    }
  }
  bVar2 = false;
LAB_001a818a:
  if (bVar2) {
    ip::basic_endpoint<asio::ip::tcp>::resize
              ((basic_endpoint<asio::ip::tcp> *)&local_48.base,(ulong)sVar6);
    *(ulong *)((long)&(__return_storage_ptr__->impl_).data_ + 0xc) =
         CONCAT44(local_48._16_4_,local_48._12_4_);
    *(undefined8 *)((long)&(__return_storage_ptr__->impl_).data_ + 0x14) = local_48._20_8_;
    *(undefined8 *)&(__return_storage_ptr__->impl_).data_ = local_48._0_8_;
    *(ulong *)((long)&(__return_storage_ptr__->impl_).data_ + 8) =
         CONCAT44(local_48._12_4_,local_48._8_4_);
  }
  else {
    *(undefined8 *)&(__return_storage_ptr__->impl_).data_ = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->impl_).data_ + 8) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->impl_).data_ + 0xc) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->impl_).data_ + 0x14) = 0;
    *(undefined8 *)&(__return_storage_ptr__->impl_).data_ = 2;
  }
  return __return_storage_ptr__;
}

Assistant:

endpoint_type remote_endpoint(const implementation_type& impl,
      asio::error_code& ec) const
  {
    endpoint_type endpoint;
    std::size_t addr_len = endpoint.capacity();
    if (socket_ops::getpeername(impl.socket_,
          endpoint.data(), &addr_len, false, ec))
      return endpoint_type();
    endpoint.resize(addr_len);
    return endpoint;
  }